

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

void run_repl(void)

{
  undefined1 local_2120 [8];
  LineArray lines;
  Vm vm;
  
  vm_init((Vm *)&lines.lines,true);
  init_line_array((LineArray *)local_2120);
  do {
    repl((Vm *)&lines.lines,(LineArray *)local_2120);
  } while( true );
}

Assistant:

void run_repl() {
    Vm vm;
    vm_init(&vm, true);

    LineArray lines;
    init_line_array(&lines);

    while (true) {
        repl(&vm, &lines);
    }
}